

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O0

void __thiscall
adios2::transport::NullTransport::Write(NullTransport *this,char *buffer,size_t size,size_t start)

{
  ulong uVar1;
  pointer pNVar2;
  Transport *this_00;
  long in_RCX;
  long in_RDX;
  string *in_RDI;
  string *in_stack_fffffffffffffe98;
  Transport *in_stack_fffffffffffffea0;
  allocator *paVar3;
  int commRank;
  string *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd62240);
  if ((pNVar2->IsOpen & 1U) == 0) {
    paVar3 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Toolkit",paVar3);
    commRank = (int)((ulong)paVar3 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"transport::NullTransport",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Write",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"transport is not open yet",&local_c9);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_RDI,
               commRank);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"write",&local_f1);
  Transport::ProfilerStart(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  this_00 = (Transport *)(local_20 + local_18);
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd624f5);
  pNVar2->CurPos = (size_t)this_00;
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd6250f);
  uVar1 = pNVar2->CurPos;
  pNVar2 = std::
           unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                         *)0xd62529);
  if (pNVar2->Capacity < uVar1) {
    pNVar2 = std::
             unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
             ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                           *)0xd62548);
    in_stack_fffffffffffffe98 = (string *)pNVar2->CurPos;
    pNVar2 = std::
             unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
             ::operator->((unique_ptr<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
                           *)0xd62562);
    pNVar2->Capacity = (size_t)in_stack_fffffffffffffe98;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffee8,"write",(allocator *)&stack0xfffffffffffffee7);
  Transport::ProfilerStop(this_00,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  return;
}

Assistant:

void NullTransport::Write(const char *buffer, size_t size, size_t start)
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "Write",
                                          "transport is not open yet");
    }

    ProfilerStart("write");
    Impl->CurPos = start + size;
    if (Impl->CurPos > Impl->Capacity)
    {
        Impl->Capacity = Impl->CurPos;
    }
    ProfilerStop("write");
}